

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall
cmComputeLinkDepends::AddLinkEntries<cmLinkImplItem>
          (cmComputeLinkDepends *this,int depender_index,
          vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *libs)

{
  vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_> *this_00
  ;
  int iVar1;
  bool bVar2;
  __type _Var3;
  reference pcVar4;
  string *__rhs;
  ulong uVar5;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_01;
  reference pvVar6;
  pointer ppVar7;
  reference ppDVar8;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar9;
  _Self local_b8;
  _Self local_b0;
  iterator dsi_1;
  _Self local_98;
  _Self local_90;
  iterator dsi;
  int local_6c;
  reference pcStack_68;
  int dependee_index;
  cmLinkItem *item;
  __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  local_58;
  const_iterator li;
  map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  dependSets;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *libs_local;
  int depender_index_local;
  cmComputeLinkDepends *this_local;
  
  std::
  map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  ::map((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
         *)&li);
  local_58._M_current =
       (cmLinkImplItem *)std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin(libs);
  while( true ) {
    item = (cmLinkItem *)std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end(libs);
    bVar2 = __gnu_cxx::operator!=
                      (&local_58,
                       (__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                        *)&item);
    if (!bVar2) break;
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
             ::operator*(&local_58);
    pcStack_68 = pcVar4;
    __rhs = cmTarget::GetName_abi_cxx11_(this->Target);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            pcVar4,__rhs);
    if ((!_Var3) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
               ::operator*(&local_58);
      local_6c = AddLinkEntry(this,&pcVar4->super_cmLinkItem);
      if (depender_index < 0) {
        std::vector<int,_std::allocator<int>_>::push_back(&this->OriginalEntries,&local_6c);
      }
      else {
        this_01 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                             (&(this->EntryConstraintGraph).
                               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                              (long)depender_index)->
                   super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
        cmGraphEdge::cmGraphEdge((cmGraphEdge *)((long)&dsi._M_node + 4),local_6c);
        std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::push_back
                  (this_01,(value_type *)((long)&dsi._M_node + 4));
      }
      local_90._M_node =
           (_Base_ptr)
           std::
           map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
           ::begin((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                    *)&li);
      while( true ) {
        local_98._M_node =
             (_Base_ptr)
             std::
             map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
             ::end((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                    *)&li);
        bVar2 = std::operator!=(&local_90,&local_98);
        if (!bVar2) break;
        pvVar6 = std::
                 vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                 ::operator[](&this->EntryList,(long)local_6c);
        if (((pvVar6->Target == (cmTarget *)0x0) &&
            (pvVar6 = std::
                      vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                      ::operator[](&this->EntryList,(long)local_6c), iVar1 = local_6c,
            (pvVar6->IsFlag & 1U) == 0)) &&
           (ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>
                     ::operator->(&local_90), iVar1 != ppVar7->first)) {
          ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>::
                   operator->(&local_90);
          pVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            (&(ppVar7->second).super_set<int,_std::less<int>,_std::allocator<int>_>,
                             &local_6c);
          dsi_1._M_node = (_Base_ptr)pVar9.first._M_node;
        }
        std::_Rb_tree_iterator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>::operator++
                  (&local_90);
      }
      ppDVar8 = std::
                vector<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
                ::operator[](&this->InferredDependSets,(long)local_6c);
      if (*ppDVar8 != (value_type)0x0) {
        std::
        map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
        ::operator[]((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                      *)&li,&local_6c);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
    ::operator++(&local_58);
  }
  local_b0._M_node =
       (_Base_ptr)
       std::
       map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
       ::begin((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                *)&li);
  while( true ) {
    local_b8._M_node =
         (_Base_ptr)
         std::
         map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
         ::end((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                *)&li);
    bVar2 = std::operator!=(&local_b0,&local_b8);
    if (!bVar2) break;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>::
             operator->(&local_b0);
    ppDVar8 = std::
              vector<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
              ::operator[](&this->InferredDependSets,(long)ppVar7->first);
    this_00 = &(*ppDVar8)->
               super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
    ;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>::
             operator->(&local_b0);
    std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>::
    push_back(this_00,&ppVar7->second);
    std::_Rb_tree_iterator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>::operator++
              (&local_b0);
  }
  std::
  map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  ::~map((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
          *)&li);
  return;
}

Assistant:

void
cmComputeLinkDepends::AddLinkEntries(
  int depender_index, std::vector<T> const& libs)
{
  // Track inferred dependency sets implied by this list.
  std::map<int, DependSet> dependSets;

  // Loop over the libraries linked directly by the depender.
  for(typename std::vector<T>::const_iterator li = libs.begin();
      li != libs.end(); ++li)
    {
    // Skip entries that will resolve to the target getting linked or
    // are empty.
    cmLinkItem const& item = *li;
    if(item == this->Target->GetName() || item.empty())
      {
      continue;
      }

    // Add a link entry for this item.
    int dependee_index = this->AddLinkEntry(*li);

    // The dependee must come after the depender.
    if(depender_index >= 0)
      {
      this->EntryConstraintGraph[depender_index].push_back(dependee_index);
      }
    else
      {
      // This is a direct dependency of the target being linked.
      this->OriginalEntries.push_back(dependee_index);
      }

    // Update the inferred dependencies for earlier items.
    for(std::map<int, DependSet>::iterator dsi = dependSets.begin();
        dsi != dependSets.end(); ++dsi)
      {
      // Add this item to the inferred dependencies of other items.
      // Target items are never inferred dependees because unknown
      // items are outside libraries that should not be depending on
      // targets.
      if(!this->EntryList[dependee_index].Target &&
         !this->EntryList[dependee_index].IsFlag &&
         dependee_index != dsi->first)
        {
        dsi->second.insert(dependee_index);
        }
      }

    // If this item needs to have dependencies inferred, do so.
    if(this->InferredDependSets[dependee_index])
      {
      // Make sure an entry exists to hold the set for the item.
      dependSets[dependee_index];
      }
    }

  // Store the inferred dependency sets discovered for this list.
  for(std::map<int, DependSet>::iterator dsi = dependSets.begin();
      dsi != dependSets.end(); ++dsi)
    {
    this->InferredDependSets[dsi->first]->push_back(dsi->second);
    }
}